

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::anon_unknown_24::DescriptorsByNameEq<google::protobuf::FileDescriptor>::operator()
          (DescriptorsByNameEq<google::protobuf::FileDescriptor> *this,FileDescriptor *lhs,
          FileDescriptor *rhs)

{
  string_view __x;
  string_view __y;
  undefined1 local_41;
  FileDescriptor *rhs_local;
  FileDescriptor *lhs_local;
  DescriptorsByNameEq<google::protobuf::FileDescriptor> *this_local;
  
  local_41 = true;
  if (lhs != rhs) {
    __x = FileDescriptor::name(lhs);
    __y = FileDescriptor::name(rhs);
    local_41 = std::operator==(__x,__y);
  }
  return local_41;
}

Assistant:

bool operator()(const DescriptorT* lhs, const DescriptorT* rhs) const {
    return lhs == rhs || lhs->name() == rhs->name();
  }